

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O0

int testing::internal::
    CountIf<std::vector<testing::TestSuite*,std::allocator<testing::TestSuite*>>,bool(*)(testing::TestSuite_const*)>
              (vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *c,
              _func_bool_TestSuite_ptr *predicate)

{
  bool bVar1;
  reference ppTVar2;
  __normal_iterator<testing::TestSuite_*const_*,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
  local_30;
  __normal_iterator<testing::TestSuite_*const_*,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
  local_28;
  const_iterator it;
  int count;
  _func_bool_TestSuite_ptr *predicate_local;
  vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *c_local;
  
  it._M_current._4_4_ = 0;
  local_28._M_current =
       (TestSuite **)
       std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::begin(c);
  while( true ) {
    local_30._M_current =
         (TestSuite **)
         std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::end(c);
    bVar1 = __gnu_cxx::
            operator==<testing::TestSuite_*const_*,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
                      (&local_28,&local_30);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppTVar2 = __gnu_cxx::
              __normal_iterator<testing::TestSuite_*const_*,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
              ::operator*(&local_28);
    bVar1 = (*predicate)(*ppTVar2);
    if (bVar1) {
      it._M_current._4_4_ = it._M_current._4_4_ + 1;
    }
    __gnu_cxx::
    __normal_iterator<testing::TestSuite_*const_*,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
    ::operator++(&local_28);
  }
  return it._M_current._4_4_;
}

Assistant:

inline int CountIf(const Container& c, Predicate predicate) {
  // Implemented as an explicit loop since std::count_if() in libCstd on
  // Solaris has a non-standard signature.
  int count = 0;
  for (auto it = c.begin(); it != c.end(); ++it) {
    if (predicate(*it))
      ++count;
  }
  return count;
}